

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_conjunctive.cpp
# Opt level: O2

BatchResult * __thiscall SelectJitOperator::next(SelectJitOperator *this)

{
  uint n;
  int *piVar1;
  int *piVar2;
  int *piVar3;
  uint *puVar4;
  int iVar5;
  undefined4 extraout_var;
  DbVector<int> *pDVar6;
  DbVector<unsigned_int> *this_01;
  uint32_t uVar7;
  uint32_t i;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  allocator<char> local_59;
  string local_58;
  SelectJitOperator *local_38;
  BatchResult *this_00;
  
  iVar5 = (*this->next_->_vptr_BaseOperator[4])();
  this_00 = (BatchResult *)CONCAT44(extraout_var,iVar5);
  if (this_00 != (BatchResult *)0x0) {
    n = **(uint **)((this_00->data)._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 2);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"tax",&local_59);
    pDVar6 = BatchResult::getCol(this_00,&local_58);
    piVar1 = pDVar6->col;
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"discount",&local_59);
    pDVar6 = BatchResult::getCol(this_00,&local_58);
    piVar2 = pDVar6->col;
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"extprice",&local_59);
    local_38 = this;
    pDVar6 = BatchResult::getCol(this_00,&local_58);
    piVar3 = pDVar6->col;
    std::__cxx11::string::~string((string *)&local_58);
    this_01 = (DbVector<unsigned_int> *)operator_new(0x10);
    DbVector<unsigned_int>::DbVector(this_01,n);
    puVar4 = this_01->col;
    if (local_38->branching_ == false) {
      uVar7 = 0;
      for (uVar8 = 0; n != uVar8; uVar8 = uVar8 + 1) {
        puVar4[uVar7] = (uint)uVar8;
        uVar9 = 0;
        if ((piVar1[uVar8] < 0x32) && (piVar2[uVar8] < 0x32)) {
          uVar9 = (uint)(piVar3[uVar8] < 0x32);
        }
        uVar7 = uVar7 + uVar9;
      }
    }
    else {
      uVar7 = 0;
      for (uVar8 = 0; n != uVar8; uVar8 = uVar8 + 1) {
        if (((piVar1[uVar8] < 0x32) && (piVar2[uVar8] < 0x32)) && (piVar3[uVar8] < 0x32)) {
          uVar10 = (ulong)uVar7;
          uVar7 = uVar7 + 1;
          puVar4[uVar10] = (uint)uVar8;
        }
      }
    }
    this_01->n = uVar7;
    this_00->res_sel = this_01;
  }
  return this_00;
}

Assistant:

BatchResult* next() {
        BatchResult *br = next_->next();
        if (br == nullptr)
            return br;

        uint32_t n = br->getn();
        int32_t *tax = br->getCol("tax")->col;
        int32_t *discount = br->getCol("discount")->col;
        int32_t *extprice = br->getCol("extprice")->col;

        DbVector<uint32_t> *res_sel = new DbVector<uint32_t>(n);
        auto res_sel_col = res_sel->col;
        uint32_t res = 0;
        if (branching_) {
            for (uint32_t i = 0; i < n; i++) {
                if (tax[i] < 50 && discount[i] < 50 && extprice[i] < 50)
                    res_sel_col[res++] = i;
            }
        }
        else {
            for (uint32_t i = 0; i < n; i++) {
                res_sel_col[res] = i;
                res += (tax[i] < 50 && discount[i] < 50 && extprice[i] < 50);
            }
        }
        res_sel->n = res;
        br->res_sel = res_sel;

        // std::cout << "n=" << res_sel->n << ", capacity=" << res_sel->capacity << ", col=" << (uint64_t)res_sel->col << "\n";
        return br;
    }